

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

bool __thiscall Clasp::Solver::backtrack(Solver *this)

{
  bool bVar1;
  Literal a_lit;
  uint32 uVar2;
  uint32 uVar3;
  Solver *in_RDI;
  Literal lastChoiceInverted;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined8 in_stack_ffffffffffffff90;
  ImpliedLiteral *n;
  uint32 in_stack_ffffffffffffff98;
  uint32 in_stack_ffffffffffffff9c;
  uint in_stack_ffffffffffffffa0;
  Antecedent in_stack_ffffffffffffffb0;
  Solver *in_stack_ffffffffffffffc0;
  Antecedent local_28;
  uint32 local_1c;
  uint32 local_18;
  Literal local_14 [5];
  
  Literal::Literal(local_14);
  do {
    a_lit.rep_ = decisionLevel((Solver *)0x1eb637);
    uVar2 = rootLevel(in_RDI);
    if (a_lit.rep_ == uVar2) {
      setStopConflict(in_stack_ffffffffffffffc0);
      return false;
    }
    decisionLevel((Solver *)0x1eb66d);
    local_1c = (uint32)decision((Solver *)
                                CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                                (uint32)((ulong)in_stack_ffffffffffffff90 >> 0x20));
    local_18 = (uint32)Literal::operator~((Literal *)
                                          CONCAT44(in_stack_ffffffffffffff8c,
                                                   in_stack_ffffffffffffff88));
    local_14[0] = (Literal)local_18;
    decisionLevel((Solver *)0x1eb69d);
    undoUntil((Solver *)CONCAT44(a_lit.rep_,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff9c,
              in_stack_ffffffffffffff98);
    decisionLevel((Solver *)0x1eb6bb);
    setBacktrackLevel((Solver *)in_stack_ffffffffffffffb0.data_,(uint32)((ulong)in_RDI >> 0x20),
                      (UndoMode)in_RDI);
    bVar1 = hasConflict((Solver *)0x1eb6d6);
    in_stack_ffffffffffffffa0 = CONCAT13(1,(int3)in_stack_ffffffffffffffa0);
    if (!bVar1) {
      Antecedent::Antecedent(&local_28,(Constraint *)0x0);
      bVar1 = force(in_RDI,(Literal *)CONCAT44(a_lit.rep_,in_stack_ffffffffffffffa0),
                    (Antecedent *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      in_stack_ffffffffffffffa0 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffa0) ^ 0xff000000;
    }
  } while ((in_stack_ffffffffffffffa0 & 0x1000000) != 0);
  n = (ImpliedLiteral *)&in_RDI->impliedLits_;
  uVar2 = decisionLevel((Solver *)0x1eb72f);
  uVar3 = decisionLevel((Solver *)0x1eb745);
  Antecedent::Antecedent((Antecedent *)&stack0xffffffffffffffb0,(Constraint *)0x0);
  ImpliedLiteral::ImpliedLiteral
            ((ImpliedLiteral *)CONCAT44(uVar2,in_stack_ffffffffffffff98),a_lit,
             (uint32)((ulong)n >> 0x20),(Antecedent *)CONCAT44(uVar3,in_stack_ffffffffffffff88),0);
  ImpliedList::add((ImpliedList *)CONCAT44(a_lit.rep_,in_stack_ffffffffffffffa0),uVar2,n);
  return true;
}

Assistant:

bool Solver::backtrack() {
	Literal lastChoiceInverted;
	do {
		if (decisionLevel() == rootLevel()) {
			setStopConflict();
			return false;
		}
		lastChoiceInverted = ~decision(decisionLevel());
		undoUntil(decisionLevel() - 1, undo_pop_proj_level);
		setBacktrackLevel(decisionLevel(), undo_pop_bt_level);
	} while (hasConflict() || !force(lastChoiceInverted, 0));
	// remember flipped literal for copyGuidingPath()
	impliedLits_.add(decisionLevel(), ImpliedLiteral(lastChoiceInverted, decisionLevel(), 0));
	return true;
}